

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.h
# Opt level: O3

int __thiscall GF2::BFunc<9UL>::Deg(BFunc<9UL> *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  uint uVar4;
  MP<9UL,_GF2::MOLex<9UL>_> poly;
  _List_node_base local_40;
  long local_30;
  
  local_30 = 0;
  local_40._M_next = &local_40;
  local_40._M_prev = &local_40;
  BFunc<9ul>::To<GF2::MOLex<9ul>>((BFunc<9ul> *)this,(MP<9UL,_GF2::MOLex<9UL>_> *)&local_40);
  p_Var3 = local_40._M_next;
  if (local_30 == 0) {
    uVar4 = 0xffffffff;
  }
  else {
    uVar4 = 0;
    p_Var2 = local_40._M_next;
    while (p_Var2 != &local_40) {
      p_Var1 = p_Var2 + 1;
      p_Var2 = (((list<GF2::MM<9UL>,_std::allocator<GF2::MM<9UL>_>_> *)&p_Var2->_M_next)->
               super__List_base<GF2::MM<9UL>,_std::allocator<GF2::MM<9UL>_>_>)._M_impl._M_node.
               super__List_node_base._M_next;
      if (uVar4 < (uint)(byte)WW<9ul>::Weight()::_bitsperoctet[(ulong)p_Var1->_M_next >> 8 & 0xff] +
                  (uint)(byte)WW<9ul>::Weight()::_bitsperoctet[(ulong)p_Var1->_M_next & 0xff]) {
        uVar4 = (uint)(byte)WW<9ul>::Weight()::_bitsperoctet[(ulong)p_Var1->_M_next >> 8 & 0xff] +
                (uint)(byte)WW<9ul>::Weight()::_bitsperoctet[(ulong)p_Var1->_M_next & 0xff];
      }
    }
  }
  while (p_Var3 != &local_40) {
    p_Var2 = p_Var3->_M_next;
    operator_delete(p_Var3,0x18);
    p_Var3 = p_Var2;
  }
  return uVar4;
}

Assistant:

int Deg() const
	{	
		MP<_n> poly;
		To(poly);
		return poly.Deg();
	}